

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Publication.cpp
# Opt level: O2

void __thiscall
aeron::Publication::Publication
          (Publication *this,ClientConductor *conductor,string *channel,int64_t registrationId,
          int64_t originalRegistrationId,int32_t streamId,int32_t sessionId,
          UnsafeBufferPosition *publicationLimit,int32_t channelStatusId,
          shared_ptr<aeron::LogBuffers> logBuffers)

{
  uint uVar1;
  uint8_t *puVar2;
  _func_int **pp_Var3;
  pointer __p;
  pointer __p_00;
  int iVar4;
  long lVar5;
  long lVar6;
  _Head_base<0UL,_aeron::concurrent::logbuffer::TermAppender_*,_false> local_38;
  
  this->_vptr_Publication = (_func_int **)&PTR__Publication_0016fc68;
  this->m_conductor = conductor;
  this->m_logMetaDataBuffer =
       (AtomicBuffer *)
       ((logBuffers.super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        _vptr_LogBuffers + 0xc);
  std::__cxx11::string::string((string *)&this->m_channel,(string *)channel);
  this->m_registrationId = registrationId;
  this->m_originalRegistrationId = originalRegistrationId;
  uVar1 = *(uint *)((logBuffers.super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->_vptr_LogBuffers + 5);
  this->m_maxPossiblePosition = (long)(int)uVar1 << 0x1f;
  this->m_streamId = streamId;
  this->m_sessionId = sessionId;
  puVar2 = this->m_logMetaDataBuffer->m_buffer;
  this->m_initialTermId = *(int32_t *)(puVar2 + 0x108);
  this->m_maxPayloadLength = *(int *)(puVar2 + 0x110) + -0x20;
  iVar4 = 0x1000000;
  if ((int)uVar1 / 8 < 0x1000000) {
    iVar4 = (int)uVar1 / 8;
  }
  this->m_maxMessageLength = iVar4;
  iVar4 = 0;
  if (uVar1 != 0) {
    for (; (uVar1 >> iVar4 & 1) == 0; iVar4 = iVar4 + 1) {
    }
  }
  this->m_positionBitsToShift = iVar4;
  concurrent::status::UnsafeBufferPosition::UnsafeBufferPosition
            (&(this->m_publicationLimit).m_impl,publicationLimit);
  this->m_channelStatusId = channelStatusId;
  (this->m_isClosed)._M_base._M_i = false;
  std::__shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->m_logBuffers).super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>
             ,(__shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2> *)
              logBuffers.super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  this->m_appenders[2]._M_t.
  super___uniq_ptr_impl<aeron::concurrent::logbuffer::TermAppender,_std::default_delete<aeron::concurrent::logbuffer::TermAppender>_>
  ._M_t.
  super__Tuple_impl<0UL,_aeron::concurrent::logbuffer::TermAppender_*,_std::default_delete<aeron::concurrent::logbuffer::TermAppender>_>
  .super__Head_base<0UL,_aeron::concurrent::logbuffer::TermAppender_*,_false>._M_head_impl =
       (TermAppender *)0x0;
  this->m_appenders[0]._M_t.
  super___uniq_ptr_impl<aeron::concurrent::logbuffer::TermAppender,_std::default_delete<aeron::concurrent::logbuffer::TermAppender>_>
  ._M_t.
  super__Tuple_impl<0UL,_aeron::concurrent::logbuffer::TermAppender_*,_std::default_delete<aeron::concurrent::logbuffer::TermAppender>_>
  .super__Head_base<0UL,_aeron::concurrent::logbuffer::TermAppender_*,_false>._M_head_impl =
       (TermAppender *)0x0;
  this->m_appenders[1]._M_t.
  super___uniq_ptr_impl<aeron::concurrent::logbuffer::TermAppender,_std::default_delete<aeron::concurrent::logbuffer::TermAppender>_>
  ._M_t.
  super__Tuple_impl<0UL,_aeron::concurrent::logbuffer::TermAppender_*,_std::default_delete<aeron::concurrent::logbuffer::TermAppender>_>
  .super__Head_base<0UL,_aeron::concurrent::logbuffer::TermAppender_*,_false>._M_head_impl =
       (TermAppender *)0x0;
  puVar2 = this->m_logMetaDataBuffer->m_buffer;
  (this->m_headerWriter).m_sessionId = *(int32_t *)(puVar2 + 0x14c);
  (this->m_headerWriter).m_streamId = *(int32_t *)(puVar2 + 0x150);
  lVar6 = 0x18;
  for (lVar5 = 0; lVar5 != 0x18; lVar5 = lVar5 + 8) {
    __p_00 = (pointer)operator_new(0x18);
    pp_Var3 = (logBuffers.super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->_vptr_LogBuffers;
    __p_00->m_termBuffer = (AtomicBuffer *)((long)pp_Var3 + lVar6);
    __p_00->m_tailBuffer = (AtomicBuffer *)(pp_Var3 + 0xc);
    __p_00->m_tailOffset = (index_t)lVar5;
    local_38._M_head_impl = (TermAppender *)0x0;
    std::
    __uniq_ptr_impl<aeron::concurrent::logbuffer::TermAppender,_std::default_delete<aeron::concurrent::logbuffer::TermAppender>_>
    ::reset((__uniq_ptr_impl<aeron::concurrent::logbuffer::TermAppender,_std::default_delete<aeron::concurrent::logbuffer::TermAppender>_>
             *)((long)&this->m_appenders[0]._M_t.
                       super___uniq_ptr_impl<aeron::concurrent::logbuffer::TermAppender,_std::default_delete<aeron::concurrent::logbuffer::TermAppender>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_aeron::concurrent::logbuffer::TermAppender_*,_std::default_delete<aeron::concurrent::logbuffer::TermAppender>_>
                       .super__Head_base<0UL,_aeron::concurrent::logbuffer::TermAppender_*,_false>.
                       _M_head_impl + lVar5),__p_00);
    std::
    unique_ptr<aeron::concurrent::logbuffer::TermAppender,_std::default_delete<aeron::concurrent::logbuffer::TermAppender>_>
    ::~unique_ptr((unique_ptr<aeron::concurrent::logbuffer::TermAppender,_std::default_delete<aeron::concurrent::logbuffer::TermAppender>_>
                   *)&local_38);
    lVar6 = lVar6 + 0x18;
  }
  return;
}

Assistant:

Publication::Publication(
    ClientConductor &conductor,
    const std::string &channel,
    std::int64_t registrationId,
    std::int64_t originalRegistrationId,
    std::int32_t streamId,
    std::int32_t sessionId,
    UnsafeBufferPosition& publicationLimit,
    std::int32_t channelStatusId,
    std::shared_ptr<LogBuffers> logBuffers)
    :
    m_conductor(conductor),
    m_logMetaDataBuffer(logBuffers->atomicBuffer(LogBufferDescriptor::LOG_META_DATA_SECTION_INDEX)),
    m_channel(channel),
    m_registrationId(registrationId),
    m_originalRegistrationId(originalRegistrationId),
    m_maxPossiblePosition(static_cast<int64_t>(logBuffers->atomicBuffer(0).capacity()) << 31),
    m_streamId(streamId),
    m_sessionId(sessionId),
    m_initialTermId(LogBufferDescriptor::initialTermId(m_logMetaDataBuffer)),
    m_maxPayloadLength(LogBufferDescriptor::mtuLength(m_logMetaDataBuffer) - DataFrameHeader::LENGTH),
    m_maxMessageLength(FrameDescriptor::computeMaxMessageLength(logBuffers->atomicBuffer(0).capacity())),
    m_positionBitsToShift(util::BitUtil::numberOfTrailingZeroes(logBuffers->atomicBuffer(0).capacity())),
    m_publicationLimit(publicationLimit),
    m_channelStatusId(channelStatusId),
    m_logBuffers(logBuffers),
    m_headerWriter(LogBufferDescriptor::defaultFrameHeader(m_logMetaDataBuffer))
{
    for (int i = 0; i < LogBufferDescriptor::PARTITION_COUNT; i++)
    {
        /*
         * TODO:
         * perhaps allow copy-construction and be able to move appenders and AtomicBuffers directly into Publication for
         * locality.
         */
        m_appenders[i] = std::unique_ptr<TermAppender>(new TermAppender(
            logBuffers->atomicBuffer(i),
            logBuffers->atomicBuffer(LogBufferDescriptor::LOG_META_DATA_SECTION_INDEX),
            i));
    }
}